

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  timediff_t tVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  curltime newer;
  curltime older;
  curltime older_00;
  curltime cVar11;
  int local_40 [2];
  time_t local_38;
  
  uVar9 = (ulong)(data->set).timeout;
  if ((int)CONCAT71(in_register_00000011,duringconnect) == 0) {
    uVar7 = 0;
    if (uVar9 == 0) {
      return 0;
    }
  }
  else {
    uVar1 = (data->set).connecttimeout;
    uVar7 = 300000;
    if (uVar1 != 0) {
      uVar7 = (ulong)uVar1;
    }
  }
  if (nowp == (curltime *)0x0) {
    cVar11 = Curl_now();
    nowp = (curltime *)&local_38;
    local_38 = cVar11.tv_sec;
    piVar8 = local_40;
    local_40[0] = cVar11.tv_usec;
  }
  else {
    piVar8 = &nowp->tv_usec;
  }
  if (uVar9 == 0) {
    uVar10 = 0;
  }
  else {
    uVar2 = (data->progress).t_startop.tv_sec;
    uVar3 = (data->progress).t_startop.tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    cVar11.tv_usec = *piVar8;
    cVar11.tv_sec = nowp->tv_sec;
    cVar11._12_4_ = 0;
    older._12_4_ = 0;
    tVar6 = Curl_timediff(cVar11,older);
    uVar10 = uVar9 - tVar6;
  }
  if (duringconnect) {
    uVar4 = (data->progress).t_startsingle.tv_sec;
    uVar5 = (data->progress).t_startsingle.tv_usec;
    older_00.tv_usec = uVar5;
    older_00.tv_sec = uVar4;
    newer.tv_usec = *piVar8;
    newer.tv_sec = nowp->tv_sec;
    newer._12_4_ = 0;
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff(newer,older_00);
    uVar7 = uVar7 - tVar6;
    if ((long)uVar7 < (long)uVar10) {
      uVar10 = uVar7;
    }
    if (uVar9 == 0) {
      uVar10 = uVar7;
    }
  }
  return -(ulong)(uVar10 == 0) | uVar10;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  unsigned int timeout_set = 0;
  timediff_t connect_timeout_ms = 0;
  timediff_t maxtime_timeout_ms = 0;
  timediff_t timeout_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */

  if(data->set.timeout > 0) {
    timeout_set = TIMEOUT_MAXTIME;
    maxtime_timeout_ms = data->set.timeout;
  }
  if(duringconnect) {
    timeout_set |= TIMEOUT_CONNECT;
    connect_timeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
  }
  if(!timeout_set)
    /* no timeout  */
    return 0;

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(timeout_set & TIMEOUT_MAXTIME) {
    maxtime_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startop);
    timeout_ms = maxtime_timeout_ms;
  }

  if(timeout_set & TIMEOUT_CONNECT) {
    connect_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startsingle);

    if(!(timeout_set & TIMEOUT_MAXTIME) ||
       (connect_timeout_ms < maxtime_timeout_ms))
      timeout_ms = connect_timeout_ms;
  }

  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}